

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROM.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
readBytesFromFile(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                 string *fileName)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  size_type __new_size;
  reference pvVar3;
  undefined1 auVar4 [16];
  char *target;
  pos_type fileSize;
  char local_228 [8];
  ifstream imageDataStream;
  string *fileName_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vec;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_228,(string *)fileName,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::istream::seekg((long)local_228,_S_beg);
    auVar4 = std::istream::tellg();
    _fileSize = auVar4._8_8_;
    target = auVar4._0_8_;
    std::istream::seekg((long)local_228,_S_beg);
    __new_size = std::fpos::operator_cast_to_long((fpos *)&target);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (__return_storage_ptr__,__new_size);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0);
    std::fpos::operator_cast_to_long((fpos *)&target);
    std::istream::read(local_228,(long)pvVar3);
    std::ifstream::close();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::shrink_to_fit
              (__return_storage_ptr__);
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> readBytesFromFile(const std::string &fileName)
{
    std::vector<uint8_t> vec;
    std::ifstream imageDataStream(fileName, std::ifstream::in | std::ifstream::binary);

    if(!imageDataStream.is_open()) {
        return vec;
    }

    imageDataStream.seekg(0, std::ios_base::end);
    const auto fileSize = imageDataStream.tellg();
    imageDataStream.seekg(0, std::ios_base::beg);

    vec.resize(fileSize);
    char *target = reinterpret_cast<char*>(&vec[0]);

    imageDataStream.read(target, fileSize);
    imageDataStream.close();

    vec.shrink_to_fit();

    return vec;
}